

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

int sink_checkphi(jit_State *J,IRIns *ira,IRRef ref)

{
  int iVar1;
  jit_State *J_00;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  IRIns *ir;
  uint3 in_stack_ffffffffffffffd4;
  uint ref_00;
  uint local_4;
  
  if (in_EDX < 0x8001) {
    local_4 = 1;
  }
  else {
    J_00 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)in_EDX * 8);
    if ((((J_00->cur).marked & 0x40) == 0) &&
       ((((J_00->cur).gct != 'U' || (*(short *)((long)&(J_00->cur).nextgc.gcptr32 + 2) != 0x1d3)) ||
        ((*(byte *)(*(long *)(in_RDI + 0x10) + 4 + (ulong)(ushort)(J_00->cur).nextgc.gcptr32 * 8) &
         0x40) == 0)))) {
      ref_00 = (uint)in_stack_ffffffffffffffd4;
      if (in_EDX < *(uint *)(in_RDI + 0x110)) {
        iVar1 = sink_phidep(J_00,ref_00);
        ref_00 = (uint)(iVar1 != 0 ^ 0xff) << 0x18;
      }
      local_4 = (uint)((byte)(ref_00 >> 0x18) & 1);
    }
    else {
      *(short *)(in_RSI + 6) = *(short *)(in_RSI + 6) + 1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int sink_checkphi(jit_State *J, IRIns *ira, IRRef ref)
{
  if (ref >= REF_FIRST) {
    IRIns *ir = IR(ref);
    if (irt_isphi(ir->t) || (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT &&
			     irt_isphi(IR(ir->op1)->t))) {
      ira->prev++;
      return 1;  /* Sinkable PHI. */
    }
    /* Otherwise the value must be loop-invariant. */
    return ref < J->loopref && !sink_phidep(J, ref);
  }
  return 1;  /* Constant (non-PHI). */
}